

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::CalendarService::CalendarService(CalendarService *this)

{
  DefaultCalendarFactory *this_00;
  UnicodeString *dname;
  DefaultCalendarFactory *local_90;
  undefined4 local_68 [2];
  UErrorCode status;
  ConstChar16Ptr local_58;
  UnicodeString local_50;
  CalendarService *local_10;
  CalendarService *this_local;
  
  local_10 = this;
  ConstChar16Ptr::ConstChar16Ptr(&local_58,L"Calendar");
  UnicodeString::UnicodeString(&local_50,'\x01',&local_58,-1);
  dname = &local_50;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString(&local_50);
  ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__CalendarService_004e9d98;
  local_68[0] = 0;
  this_00 = (DefaultCalendarFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  local_90 = (DefaultCalendarFactory *)0x0;
  if (this_00 != (DefaultCalendarFactory *)0x0) {
    DefaultCalendarFactory::DefaultCalendarFactory(this_00);
    local_90 = this_00;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,local_90,local_68);
  return;
}

Assistant:

CalendarService()
        : ICULocaleService(UNICODE_STRING_SIMPLE("Calendar"))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new DefaultCalendarFactory(), status);
    }